

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

bool __thiscall
wasm::PrintExpressionContents::printUnreachableOrNullReplacement
          (PrintExpressionContents *this,Expression *curr)

{
  bool bVar1;
  bool local_25;
  BasicType local_24;
  Expression *local_20;
  Expression *curr_local;
  PrintExpressionContents *this_local;
  
  local_24 = unreachable;
  local_20 = curr;
  curr_local = (Expression *)this;
  bVar1 = wasm::Type::operator==(&curr->type,&local_24);
  local_25 = true;
  if (!bVar1) {
    local_25 = wasm::Type::isNull(&local_20->type);
  }
  if (local_25 != false) {
    printMedium(this->o,"block");
  }
  return local_25 != false;
}

Assistant:

bool printUnreachableOrNullReplacement(Expression* curr) {
    if (curr->type == Type::unreachable || curr->type.isNull()) {
      printMedium(o, "block");
      return true;
    }
    return false;
  }